

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QColorPicker::mouseMoveEvent(QColorPicker *this,QMouseEvent *m)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar6 [16];
  QRect QVar7;
  QPoint p;
  QPoint local_58;
  int local_50;
  int local_4c;
  void *local_48;
  int *piStack_40;
  int *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  uVar3 = QEventPoint::position();
  auVar6._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
  auVar6._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM0_Qa;
  auVar6 = minpd(_DAT_0066f5d0,auVar6);
  auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
  auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
  uVar4 = movmskpd(uVar3,auVar5);
  iVar1 = (int)auVar6._8_8_;
  if ((uVar4 & 2) == 0) {
    iVar1 = -0x80000000;
  }
  iVar2 = (int)auVar6._0_8_;
  if ((uVar4 & 1) == 0) {
    iVar2 = -0x80000000;
  }
  QVar7 = QWidget::contentsRect((QWidget *)this);
  local_58.xp.m_i = iVar1 - QVar7.x1.m_i;
  local_58.yp.m_i = iVar2 - QVar7.y1.m_i;
  if (*(int *)(m + 0x44) == 0) {
    m[0xc] = (QMouseEvent)0x0;
  }
  else {
    setCol(this,&local_58);
    local_4c = this->hue;
    local_50 = this->sat;
    piStack_40 = &local_4c;
    local_38 = &local_50;
    local_48 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::mouseMoveEvent(QMouseEvent *m)
{
    QPoint p = m->position().toPoint() - contentsRect().topLeft();
    if (m->buttons() == Qt::NoButton) {
        m->ignore();
        return;
    }
    setCol(p);
    emit newCol(hue, sat);
}